

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O0

void anon_unknown.dwarf_adcb1::push
               (not_null<pstore::broker::command_processor_*> cp,string *message)

{
  char *t;
  ulong uVar1;
  command_processor *this;
  undefined1 local_38 [16];
  __single_object msg;
  quoted local_20;
  string *local_18;
  string *message_local;
  not_null<pstore::broker::command_processor_*> cp_local;
  
  local_18 = message;
  message_local = (string *)cp.ptr_;
  t = (char *)std::__cxx11::string::c_str();
  pstore::gsl::not_null<const_char_*>::not_null((not_null<const_char_*> *)&msg,t);
  pstore::logger::quoted::quoted
            (&local_20,
             (not_null<const_char_*>)
             msg._M_t.
             super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
             .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl);
  pstore::log<pstore::logger::quoted>(info,"push command ",local_20);
  uVar1 = std::__cxx11::string::length();
  if (uVar1 < 0xf5) {
    local_38._4_4_ =
         std::__atomic_base<unsigned_int>::operator++
                   (&push::mid.super___atomic_base<unsigned_int>,0);
    local_38._2_2_ = 0;
    local_38._0_2_ = 1;
    std::
    make_unique<pstore::brokerface::message_type,unsigned_int,unsigned_short,unsigned_short,std::__cxx11::string_const&>
              ((uint *)(local_38 + 8),(unsigned_short *)(local_38 + 4),
               (unsigned_short *)(local_38 + 2),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    this = pstore::gsl::not_null<pstore::broker::command_processor_*>::operator->
                     ((not_null<pstore::broker::command_processor_*> *)&message_local);
    pstore::broker::command_processor::push_command
              (this,(message_ptr *)(local_38 + 8),(recorder *)0x0);
    std::
    unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
    ::~unique_ptr((unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                   *)(local_38 + 8));
    return;
  }
  pstore::assert_failed
            ("message.length () <= pstore::brokerface::message_type::payload_chars",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/quit.cpp"
             ,0x37);
}

Assistant:

void push (not_null<pstore::broker::command_processor *> const cp,
               std::string const & message) {
        static std::atomic<std::uint32_t> mid{0};

        log (priority::info, "push command ", pstore::logger::quoted{message.c_str ()});

        PSTORE_ASSERT (message.length () <= pstore::brokerface::message_type::payload_chars);
        auto msg = std::make_unique<pstore::brokerface::message_type> (mid++, std::uint16_t{0},
                                                                       std::uint16_t{1}, message);
        cp->push_command (std::move (msg), nullptr);
    }